

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZProjectEllipse.cpp
# Opt level: O0

bool __thiscall TPZProjectEllipse::AdjustingWithEllipse(TPZProjectEllipse *this)

{
  double dVar1;
  bool bVar2;
  int64_t iVar3;
  double *pdVar4;
  TPZBaseMatrix *in_RDI;
  double dVar5;
  TPZManVector<double,_10> NewCoeffs;
  float Tol;
  TPZManVector<double,_10> NewCoeffs_1;
  TPZManVector<double,_10> VectorK;
  TPZManVector<double,_10> VectorJ;
  TPZManVector<double,_10> VectorI;
  TPZManVector<double,_10> Ratios;
  TPZManVector<double,_10> Center;
  int dim;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  TPZManVector<double,_10> *in_stack_fffffffffffffb68;
  TPZManVector<double,_10> *in_stack_fffffffffffffb70;
  int64_t in_stack_fffffffffffffb78;
  TPZManVector<double,_10> *in_stack_fffffffffffffb80;
  TPZVec<double> *in_stack_fffffffffffffb88;
  TPZManVector<double,_10> *in_stack_fffffffffffffb90;
  TPZVec<double> local_3e8 [2];
  ostream *in_stack_fffffffffffffc58;
  TPZVec<double> *in_stack_fffffffffffffc60;
  TPZVec<double> *in_stack_fffffffffffffc68;
  TPZProjectEllipse *in_stack_fffffffffffffc70;
  TPZVec<double> *in_stack_fffffffffffffcb8;
  TPZVec<double> *in_stack_fffffffffffffcc0;
  TPZProjectEllipse *in_stack_fffffffffffffcc8;
  size_t in_stack_ffffffffffffff68;
  char *fileName;
  bool local_1;
  
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  fileName = (char *)0x0;
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(double *)in_stack_fffffffffffffb70
            );
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(double *)in_stack_fffffffffffffb70
            );
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(double *)in_stack_fffffffffffffb70
            );
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(double *)in_stack_fffffffffffffb70
            );
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(double *)in_stack_fffffffffffffb70
            );
  bVar2 = LeastSquaresToGetEllipse((TPZProjectEllipse *)NewCoeffs_1.fExtAlloc[5]);
  if (!bVar2) {
    local_1 = false;
    goto LAB_01c6e9a4;
  }
  if ((int)iVar3 == 2) {
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[4].fDecomposed,2);
    bVar2 = IsZero(*pdVar4);
    if (bVar2) {
      TPZManVector<double,_10>::TPZManVector
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (double *)in_stack_fffffffffffffb70);
      TPZManVector<double,_10>::TPZManVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      TPZManVector<double,_10>::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      TPZManVector<double,_10>::~TPZManVector
                ((TPZManVector<double,_10> *)
                 CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
      ZeroTolerance<float,_nullptr>((float *)0x1c6e56e);
      local_1 = StandardFormatForSimpleEllipse
                          (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                           in_stack_fffffffffffffcb8);
      if (local_1) {
        PrintingAsSimpleEquation
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                   in_stack_fffffffffffffc58);
      }
      TPZManVector<double,_10>::~TPZManVector
                ((TPZManVector<double,_10> *)
                 CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
      goto LAB_01c6e9a4;
    }
  }
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffffb70,(int64_t)in_stack_fffffffffffffb68);
  pzinternal::DebugStopImpl(fileName,in_stack_ffffffffffffff68);
  if ((int)iVar3 == 2) {
    pdVar4 = TPZVec<double>::operator[](local_3e8,0);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_3e8,2);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[4].fDecomposed,0);
    *pdVar4 = -(dVar5 / dVar1);
    pdVar4 = TPZVec<double>::operator[](local_3e8,1);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_3e8,2);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[4].fDecomposed,1);
    *pdVar4 = -(dVar5 / dVar1);
    pdVar4 = TPZVec<double>::operator[](local_3e8,3);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_3e8,2);
    dVar5 = -(dVar5 / *pdVar4);
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[4].fDecomposed,2);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](local_3e8,4);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_3e8,2);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[4].fDecomposed,3);
    *pdVar4 = -(dVar5 / dVar1);
    in_stack_fffffffffffffb57 =
         StandardFormatForSimpleEllipse
                   (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    if ((bool)in_stack_fffffffffffffb57) {
      PrintingAsSimpleEquation
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffc58);
      goto LAB_01c6e984;
    }
    local_1 = false;
  }
  else {
LAB_01c6e984:
    local_1 = true;
  }
  TPZManVector<double,_10>::~TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
LAB_01c6e9a4:
  TPZManVector<double,_10>::~TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  TPZManVector<double,_10>::~TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  TPZManVector<double,_10>::~TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  TPZManVector<double,_10>::~TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  TPZManVector<double,_10>::~TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  return local_1;
}

Assistant:

bool TPZProjectEllipse::AdjustingWithEllipse() {
    
    int dim = fPoints.Cols();
	TPZManVector<REAL> Center(dim,0.);
	TPZManVector<REAL> Ratios(dim,0.);
	TPZManVector<REAL> VectorI(dim,0.);
	TPZManVector<REAL> VectorJ(dim,0.);
	TPZManVector<REAL> VectorK(dim,0.);
	// Applying least squares for these five points
	if(!LeastSquaresToGetEllipse())
		return false;
    
	// In case a12 = 0, then don't exist rotation then it is a ellipse with parallel axes to cartesian axes
	if(dim==2 && IsZero(fcoefficients[2])) {
		TPZManVector<REAL> NewCoeffs(4,0.);
        NewCoeffs = fcoefficients;
		// Making zero depending on Tolerance
		float Tol;
		ZeroTolerance(Tol);
        
		// Getting the values of the center and ratios for the ellipse from Coeffs values
		if(!StandardFormatForSimpleEllipse(Center,Ratios))
			return false;
		PrintingAsSimpleEquation(Center,Ratios,std::cout);
		return true;
	}
    
	// Diagonalization of the quadratic form when Coeffs(2,0) is not null
	TPZManVector<REAL> NewCoeffs;
    DebugStop();
	//DiagonalizingQuadraticForm(NewCoeffs,std::cout);
    
	// The coefficients are multiplied by (-1/lambda2)
	if(dim==2) {
		fcoefficients[0] = -(NewCoeffs[0]/NewCoeffs[2]);
		fcoefficients[1] = -(NewCoeffs[1]/NewCoeffs[2]);
		fcoefficients[2] = -(NewCoeffs[3]/NewCoeffs[2]);
		fcoefficients[3] = -(NewCoeffs[4]/NewCoeffs[2]);
		// Getting the values of the center and ratios for the ellipse from Coeffs values
		if(!StandardFormatForSimpleEllipse(Center,Ratios))
			return false;
		PrintingAsSimpleEquation(Center,Ratios,std::cout);
	}
    
	return true;
}